

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O0

bool ON_GetPointListBoundingBox
               (int dim,bool is_rat,int count,int stride,double *points,ON_BoundingBox *tight_bbox,
               int bGrowBox,ON_Xform *xform)

{
  bool bVar1;
  double *pdVar2;
  double dVar3;
  int local_8c;
  int wi;
  int i;
  double w;
  ON_3dPoint P;
  ON_BoundingBox bbox;
  bool rc;
  ON_BoundingBox *tight_bbox_local;
  double *points_local;
  int local_18;
  int stride_local;
  int count_local;
  bool is_rat_local;
  int dim_local;
  
  bbox.m_max.z._7_1_ = 0;
  if ((bGrowBox != 0) && (bVar1 = ON_BoundingBox::IsValid(tight_bbox), !bVar1)) {
    bGrowBox = 0;
  }
  if (bGrowBox == 0) {
    ON_BoundingBox::Destroy(tight_bbox);
  }
  stride_local._3_1_ = is_rat;
  if (is_rat) {
    stride_local._3_1_ = 1;
  }
  if ((((count < 1) || (dim < 1)) || (points == (double *)0x0)) ||
     ((count != 1 && (stride < (int)(dim + (uint)(stride_local._3_1_ & 1)))))) {
    if (bGrowBox != 0) {
      bbox.m_max.z._7_1_ = count == 0;
    }
  }
  else {
    ON_BoundingBox::ON_BoundingBox((ON_BoundingBox *)&P.z);
    ON_3dPoint::ON_3dPoint((ON_3dPoint *)&w,0.0,0.0,0.0);
    if ((xform != (ON_Xform *)0x0) && (bVar1 = ON_Xform::IsIdentity(xform,0.0), bVar1)) {
      xform = (ON_Xform *)0x0;
    }
    count_local = dim;
    if (3 < dim) {
      count_local = 3;
    }
    bbox.m_max.z._7_1_ = 1;
    tight_bbox_local = (ON_BoundingBox *)points;
    local_18 = count;
    if ((stride_local._3_1_ & 1) != 0) {
      while( true ) {
        bVar1 = false;
        if (0 < local_18) {
          bVar1 = (&(tight_bbox_local->m_min).x)[dim] == 0.0;
        }
        if (!bVar1) break;
        local_18 = local_18 + -1;
        tight_bbox_local = (ON_BoundingBox *)(&(tight_bbox_local->m_min).x + stride);
        bbox.m_max.z._7_1_ = 0;
      }
      if (local_18 < 1) {
        return false;
      }
    }
    memcpy(&P.z,tight_bbox_local,(long)count_local << 3);
    if ((stride_local._3_1_ & 1) != 0) {
      dVar3 = 1.0 / (&(tight_bbox_local->m_min).x)[dim];
      P.z = dVar3 * P.z;
      bbox.m_min.x = dVar3 * bbox.m_min.x;
      bbox.m_min.y = dVar3 * bbox.m_min.y;
    }
    if (xform != (ON_Xform *)0x0) {
      ON_3dPoint::Transform((ON_3dPoint *)&P.z,xform);
    }
    bbox.m_min.z = P.z;
    bbox.m_max.x = bbox.m_min.x;
    bbox.m_max.y = bbox.m_min.y;
    tight_bbox_local = (ON_BoundingBox *)(&(tight_bbox_local->m_min).x + stride);
    local_18 = local_18 + -1;
    if (0 < local_18) {
      if ((stride_local._3_1_ & 1) == 0) {
        if (xform == (ON_Xform *)0x0) {
          while (local_18 != 0) {
            memcpy(&w,tight_bbox_local,(long)count_local << 3);
            if (P.z <= w) {
              if (bbox.m_min.z < w) {
                bbox.m_min.z = w;
              }
            }
            else {
              P.z = w;
            }
            if (bbox.m_min.x <= P.x) {
              if (bbox.m_max.x < P.x) {
                bbox.m_max.x = P.x;
              }
            }
            else {
              bbox.m_min.x = P.x;
            }
            if (bbox.m_min.y <= P.y) {
              if (bbox.m_max.y < P.y) {
                bbox.m_max.y = P.y;
              }
            }
            else {
              bbox.m_min.y = P.y;
            }
            tight_bbox_local = (ON_BoundingBox *)(&(tight_bbox_local->m_min).x + stride);
            local_18 = local_18 + -1;
          }
        }
        else {
          while (local_18 != 0) {
            memcpy(&w,tight_bbox_local,(long)count_local << 3);
            ON_3dPoint::Transform((ON_3dPoint *)&w,xform);
            if (P.z <= w) {
              if (bbox.m_min.z < w) {
                bbox.m_min.z = w;
              }
            }
            else {
              P.z = w;
            }
            if (bbox.m_min.x <= P.x) {
              if (bbox.m_max.x < P.x) {
                bbox.m_max.x = P.x;
              }
            }
            else {
              bbox.m_min.x = P.x;
            }
            if (bbox.m_min.y <= P.y) {
              if (bbox.m_max.y < P.y) {
                bbox.m_max.y = P.y;
              }
            }
            else {
              bbox.m_min.y = P.y;
            }
            tight_bbox_local = (ON_BoundingBox *)(&(tight_bbox_local->m_min).x + stride);
            local_18 = local_18 + -1;
          }
          if (count_local < 3) {
            for (local_8c = count_local; local_8c < 3; local_8c = local_8c + 1) {
              pdVar2 = ON_3dPoint::operator[]((ON_3dPoint *)&P.z,local_8c);
              *pdVar2 = 0.0;
              pdVar2 = ON_3dPoint::operator[]((ON_3dPoint *)&bbox.m_min.z,local_8c);
              *pdVar2 = 0.0;
            }
          }
        }
      }
      else if (xform == (ON_Xform *)0x0) {
        while (local_18 != 0) {
          dVar3 = (&(tight_bbox_local->m_min).x)[dim];
          if ((dVar3 != 0.0) || (NAN(dVar3))) {
            memcpy(&w,tight_bbox_local,(long)count_local << 3);
            dVar3 = 1.0 / dVar3;
            w = dVar3 * w;
            P.x = dVar3 * P.x;
            P.y = dVar3 * P.y;
            dVar3 = w;
            if ((P.z <= w) && (dVar3 = P.z, bbox.m_min.z < w)) {
              bbox.m_min.z = w;
            }
            P.z = dVar3;
            dVar3 = P.x;
            if ((bbox.m_min.x <= P.x) && (dVar3 = bbox.m_min.x, bbox.m_max.x < P.x)) {
              bbox.m_max.x = P.x;
            }
            bbox.m_min.x = dVar3;
            dVar3 = P.y;
            if ((bbox.m_min.y <= P.y) && (dVar3 = bbox.m_min.y, bbox.m_max.y < P.y)) {
              bbox.m_max.y = P.y;
            }
          }
          else {
            bbox.m_max.z._7_1_ = 0;
            dVar3 = bbox.m_min.y;
          }
          bbox.m_min.y = dVar3;
          tight_bbox_local = (ON_BoundingBox *)(&(tight_bbox_local->m_min).x + stride);
          local_18 = local_18 + -1;
        }
      }
      else {
        while (local_18 != 0) {
          dVar3 = (&(tight_bbox_local->m_min).x)[dim];
          if ((dVar3 != 0.0) || (NAN(dVar3))) {
            memcpy(&w,tight_bbox_local,(long)count_local << 3);
            dVar3 = 1.0 / dVar3;
            w = dVar3 * w;
            P.x = dVar3 * P.x;
            P.y = dVar3 * P.y;
            ON_3dPoint::Transform((ON_3dPoint *)&w,xform);
            if (P.z <= w) {
              if (bbox.m_min.z < w) {
                bbox.m_min.z = w;
              }
            }
            else {
              P.z = w;
            }
            if (bbox.m_min.x <= P.x) {
              if (bbox.m_max.x < P.x) {
                bbox.m_max.x = P.x;
              }
            }
            else {
              bbox.m_min.x = P.x;
            }
            if (bbox.m_min.y <= P.y) {
              if (bbox.m_max.y < P.y) {
                bbox.m_max.y = P.y;
              }
            }
            else {
              bbox.m_min.y = P.y;
            }
          }
          else {
            bbox.m_max.z._7_1_ = 0;
          }
          tight_bbox_local = (ON_BoundingBox *)(&(tight_bbox_local->m_min).x + stride);
          local_18 = local_18 + -1;
        }
        if (count_local < 3) {
          for (local_8c = count_local; local_8c < 3; local_8c = local_8c + 1) {
            pdVar2 = ON_3dPoint::operator[]((ON_3dPoint *)&P.z,local_8c);
            *pdVar2 = 0.0;
            pdVar2 = ON_3dPoint::operator[]((ON_3dPoint *)&bbox.m_min.z,local_8c);
            *pdVar2 = 0.0;
          }
        }
      }
    }
    ON_BoundingBox::Union(tight_bbox,(ON_BoundingBox *)&P.z);
  }
  return (bool)(bbox.m_max.z._7_1_ & 1);
}

Assistant:

bool ON_GetPointListBoundingBox( 
    int dim, bool is_rat, int count, int stride, const double* points, 
    ON_BoundingBox& tight_bbox,
    int bGrowBox,
    const ON_Xform* xform
    )
{
  // bounding box workhorse
  bool rc = false;
  if ( bGrowBox && !tight_bbox.IsValid() )
  {
    bGrowBox = false;
  }
  if ( !bGrowBox )
  {
    tight_bbox.Destroy();
  }
  if ( is_rat )
  {
    is_rat = 1;
  }

  if ( count > 0 && dim > 0 && points && (count == 1 || stride >= dim+is_rat) ) 
  {
    ON_BoundingBox bbox;
    ON_3dPoint P(0.0,0.0,0.0);
    double w;
    int i, wi;

    if ( xform && xform->IsIdentity() )
    {
      xform = 0;
    }
    wi = dim;
    if ( dim > 3 )
    {
      dim = 3;
    }

    rc = true;
    if ( is_rat ) 
    {
      // skip bogus starting points
      while ( count > 0 && points[wi] == 0.0 ) 
      {
        count--;
        points += stride;
        rc = false;
      }
      if ( count <= 0 )
        return false;
    }

    memcpy( &bbox.m_min.x, points, dim*sizeof(bbox.m_min.x) );
    if ( is_rat )
    {
      w = 1.0/points[wi];
      bbox.m_min.x *= w; bbox.m_min.y *= w; bbox.m_min.z *= w;
    }
    if ( xform )
    {
      bbox.m_min.Transform(*xform);
    }
    bbox.m_max = bbox.m_min;
    points += stride;
    count--;

    if ( count > 0 ) 
    {
      if ( is_rat )
      {
        // homogeneous rational points
        if ( xform )
        {
          for ( /*empty*/; count--; points += stride ) 
          {
            if ( 0.0 == (w = points[wi]) ) 
            {
              rc = false;
              continue;
            }
            memcpy( &P.x, points, dim*sizeof(P.x) );
            w = 1.0/w;
            P.x *= w; P.y *= w; P.z *= w;
            P.Transform(*xform);
            if ( bbox.m_min.x > P.x ) bbox.m_min.x = P.x; else if ( bbox.m_max.x < P.x ) bbox.m_max.x = P.x;
            if ( bbox.m_min.y > P.y ) bbox.m_min.y = P.y; else if ( bbox.m_max.y < P.y ) bbox.m_max.y = P.y;
            if ( bbox.m_min.z > P.z ) bbox.m_min.z = P.z; else if ( bbox.m_max.z < P.z ) bbox.m_max.z = P.z;
          }
          if ( dim < 3 )
          {
            for ( i = dim; i < 3; i++)
            {
              bbox.m_min[i] = 0.0;
              bbox.m_max[i] = 0.0;
            }
          }
        }
        else
        {
          for ( /*empty*/; count--; points += stride ) 
          {
            if ( 0.0 == (w = points[wi]) ) 
            {
              rc = false;
              continue;
            }
            memcpy( &P.x, points, dim*sizeof(P.x) );
            w = 1.0/w;
            P.x *= w; P.y *= w; P.z *= w;
            if ( bbox.m_min.x > P.x ) bbox.m_min.x = P.x; else if ( bbox.m_max.x < P.x ) bbox.m_max.x = P.x;
            if ( bbox.m_min.y > P.y ) bbox.m_min.y = P.y; else if ( bbox.m_max.y < P.y ) bbox.m_max.y = P.y;
            if ( bbox.m_min.z > P.z ) bbox.m_min.z = P.z; else if ( bbox.m_max.z < P.z ) bbox.m_max.z = P.z;
          }
        }
      }
      else 
      {
        // bounding box of non-rational points
        if ( xform )
        {
          for ( /*empty*/; count--; points += stride ) 
          {
            memcpy( &P.x, points, dim*sizeof(P.x) );
            P.Transform(*xform);
            if ( bbox.m_min.x > P.x ) bbox.m_min.x = P.x; else if ( bbox.m_max.x < P.x ) bbox.m_max.x = P.x;
            if ( bbox.m_min.y > P.y ) bbox.m_min.y = P.y; else if ( bbox.m_max.y < P.y ) bbox.m_max.y = P.y;
            if ( bbox.m_min.z > P.z ) bbox.m_min.z = P.z; else if ( bbox.m_max.z < P.z ) bbox.m_max.z = P.z;
          }
          if ( dim < 3 )
          {
            for ( i = dim; i < 3; i++)
            {
              bbox.m_min[i] = 0.0;
              bbox.m_max[i] = 0.0;
            }
          }
        }
        else
        {
          for ( /*empty*/; count--; points += stride ) 
          {
            memcpy( &P.x, points, dim*sizeof(P.x) );
            if ( bbox.m_min.x > P.x ) bbox.m_min.x = P.x; else if ( bbox.m_max.x < P.x ) bbox.m_max.x = P.x;
            if ( bbox.m_min.y > P.y ) bbox.m_min.y = P.y; else if ( bbox.m_max.y < P.y ) bbox.m_max.y = P.y;
            if ( bbox.m_min.z > P.z ) bbox.m_min.z = P.z; else if ( bbox.m_max.z < P.z ) bbox.m_max.z = P.z;
          }
        }
      }
    }

    tight_bbox.Union(bbox);
  }
  else if ( bGrowBox ) 
  {
    // result is still valid if no points are added to a valid input box
    rc = (0 == count);
  }

  return rc;
}